

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode http2_data_done_send(Curl_cfilter *cf,Curl_easy *data)

{
  long *plVar1;
  size_t sVar2;
  stream_ctx *local_38;
  stream_ctx *stream;
  CURLcode result;
  cf_h2_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
    local_38 = (stream_ctx *)0x0;
  }
  else {
    local_38 = (stream_ctx *)((data->req).p.http)->h2_ctx;
  }
  if (((plVar1 != (long *)0x0) && (*plVar1 != 0)) && (local_38 != (stream_ctx *)0x0)) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"[%d] data done send",(ulong)(uint)local_38->id);
    }
    if (((local_38->send_closed & 1U) == 0) &&
       (local_38->send_closed = true, local_38->upload_left != 0)) {
      sVar2 = Curl_bufq_len(&local_38->sendbuf);
      local_38->upload_left = sVar2;
      nghttp2_session_resume_data((nghttp2_session *)*plVar1,local_38->id);
      drain_stream(cf,data,local_38);
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode http2_data_done_send(struct Curl_cfilter *cf,
                                     struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  struct stream_ctx *stream = H2_STREAM_CTX(data);

  if(!ctx || !ctx->h2 || !stream)
    goto out;

  CURL_TRC_CF(data, cf, "[%d] data done send", stream->id);
  if(!stream->send_closed) {
    stream->send_closed = TRUE;
    if(stream->upload_left) {
      /* we now know that everything that is buffered is all there is. */
      stream->upload_left = Curl_bufq_len(&stream->sendbuf);
      /* resume sending here to trigger the callback to get called again so
         that it can signal EOF to nghttp2 */
      (void)nghttp2_session_resume_data(ctx->h2, stream->id);
      drain_stream(cf, data, stream);
    }
  }

out:
  return result;
}